

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_alternate.h
# Opt level: O0

void __thiscall PlayerAlternate::~PlayerAlternate(PlayerAlternate *this)

{
  void *in_RDI;
  
  ~PlayerAlternate((PlayerAlternate *)0x105f68);
  operator_delete(in_RDI);
  return;
}

Assistant:

PlayerAlternate(const std::string& name) :
      Player(name),
      m_first(rand()%3),
      m_second(beats(m_first))
   {}